

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdVerifyPsbtTxIn(void *handle,void *psbt_handle,char *txid,uint32_t vout)

{
  bool bVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  Txid txid_obj;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  OutPoint *in_stack_000005d8;
  Psbt *in_stack_000005e0;
  string *in_stack_fffffffffffffe10;
  CfdError in_stack_fffffffffffffe1c;
  CfdException *in_stack_fffffffffffffe20;
  OutPoint local_158;
  allocator local_129;
  string local_128;
  string *in_stack_ffffffffffffff08;
  pointer in_stack_ffffffffffffff10;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [48];
  undefined4 local_28;
  uint32_t local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  local_28 = 0xffffffff;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"PsbtHandle",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x95e;
    local_80.funcname = "CfdVerifyPsbtTxIn";
    cfd::core::logger::warn<>(&local_80,"txid is null or empty.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. txid is null or empty.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_68 + 0x18) == 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x964;
    local_c0.funcname = "CfdVerifyPsbtTxIn";
    cfd::core::logger::warn<>(&local_c0,"psbt is null.");
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Failed to handle statement. psbt is null.",&local_e1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,local_20,&local_129);
  cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffef8,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  cfd::core::OutPoint::OutPoint(&local_158,(Txid *)&stack0xfffffffffffffef8,local_24);
  cfd::Psbt::Verify(in_stack_000005e0,in_stack_000005d8);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x600b18);
  local_4 = 0;
  cfd::core::Txid::~Txid((Txid *)0x600b30);
  return local_4;
}

Assistant:

int CfdVerifyPsbtTxIn(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Txid txid_obj(txid);
    psbt_obj->psbt->Verify(OutPoint(txid_obj, vout));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
    if (std::string(except.what()) == "psbt txin not finalized yet.") {
      result = kCfdSignVerificationError;
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}